

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

Vector3 GetCameraForward(Camera *camera)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Vector3 VVar5;
  
  uVar1 = (camera->position).x;
  uVar3 = (camera->position).y;
  uVar2 = (camera->target).x;
  uVar4 = (camera->target).y;
  VVar5.x = (float)uVar2 - (float)uVar1;
  VVar5.y = (float)uVar4 - (float)uVar3;
  VVar5.z = (camera->target).z - (camera->position).z;
  VVar5 = Vector3Normalize(VVar5);
  return VVar5;
}

Assistant:

Vector3 GetCameraForward(Camera *camera)
{
    return Vector3Normalize(Vector3Subtract(camera->target, camera->position));
}